

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O0

bool google::ParseExpression(State *state)

{
  bool bVar1;
  undefined1 local_48 [8];
  State copy;
  State *state_local;
  
  copy._40_8_ = state;
  bVar1 = ParseTemplateParam(state);
  if ((bVar1) || (bVar1 = ParseExprPrimary((State *)copy._40_8_), bVar1)) {
    state_local._7_1_ = true;
  }
  else {
    memcpy(local_48,(void *)copy._40_8_,0x30);
    bVar1 = ParseOperatorName((State *)copy._40_8_);
    if ((bVar1) &&
       (((bVar1 = ParseExpression((State *)copy._40_8_), bVar1 &&
         (bVar1 = ParseExpression((State *)copy._40_8_), bVar1)) &&
        (bVar1 = ParseExpression((State *)copy._40_8_), bVar1)))) {
      state_local._7_1_ = true;
    }
    else {
      memcpy((void *)copy._40_8_,local_48,0x30);
      bVar1 = ParseOperatorName((State *)copy._40_8_);
      if (((bVar1) && (bVar1 = ParseExpression((State *)copy._40_8_), bVar1)) &&
         (bVar1 = ParseExpression((State *)copy._40_8_), bVar1)) {
        state_local._7_1_ = true;
      }
      else {
        memcpy((void *)copy._40_8_,local_48,0x30);
        bVar1 = ParseOperatorName((State *)copy._40_8_);
        if ((bVar1) && (bVar1 = ParseExpression((State *)copy._40_8_), bVar1)) {
          state_local._7_1_ = true;
        }
        else {
          memcpy((void *)copy._40_8_,local_48,0x30);
          bVar1 = ParseTwoCharToken((State *)copy._40_8_,"st");
          if ((bVar1) && (bVar1 = ParseType((State *)copy._40_8_), bVar1)) {
            state_local._7_1_ = true;
          }
          else {
            memcpy((void *)copy._40_8_,local_48,0x30);
            bVar1 = ParseTwoCharToken((State *)copy._40_8_,"sr");
            if ((((bVar1) && (bVar1 = ParseType((State *)copy._40_8_), bVar1)) &&
                (bVar1 = ParseUnqualifiedName((State *)copy._40_8_), bVar1)) &&
               (bVar1 = ParseTemplateArgs((State *)copy._40_8_), bVar1)) {
              state_local._7_1_ = true;
            }
            else {
              memcpy((void *)copy._40_8_,local_48,0x30);
              bVar1 = ParseTwoCharToken((State *)copy._40_8_,"sr");
              if (((bVar1) && (bVar1 = ParseType((State *)copy._40_8_), bVar1)) &&
                 (bVar1 = ParseUnqualifiedName((State *)copy._40_8_), bVar1)) {
                state_local._7_1_ = true;
              }
              else {
                memcpy((void *)copy._40_8_,local_48,0x30);
                state_local._7_1_ = false;
              }
            }
          }
        }
      }
    }
  }
  return state_local._7_1_;
}

Assistant:

static bool ParseExpression(State *state) {
  if (ParseTemplateParam(state) || ParseExprPrimary(state)) {
    return true;
  }

  State copy = *state;
  if (ParseOperatorName(state) &&
      ParseExpression(state) &&
      ParseExpression(state) &&
      ParseExpression(state)) {
    return true;
  }
  *state = copy;

  if (ParseOperatorName(state) &&
      ParseExpression(state) &&
      ParseExpression(state)) {
    return true;
  }
  *state = copy;

  if (ParseOperatorName(state) &&
      ParseExpression(state)) {
    return true;
  }
  *state = copy;

  if (ParseTwoCharToken(state, "st") && ParseType(state)) {
    return true;
  }
  *state = copy;

  if (ParseTwoCharToken(state, "sr") && ParseType(state) &&
      ParseUnqualifiedName(state) &&
      ParseTemplateArgs(state)) {
    return true;
  }
  *state = copy;

  if (ParseTwoCharToken(state, "sr") && ParseType(state) &&
      ParseUnqualifiedName(state)) {
    return true;
  }
  *state = copy;
  return false;
}